

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O3

void wasm::OptUtils::replaceFunctions
               (PassRunner *runner,Module *module,
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *replacements)

{
  _Invoker_type *__dest;
  Module **ppMVar1;
  pointer puVar2;
  Export *pEVar3;
  _Base_ptr p_Var4;
  const_iterator cVar5;
  variant<wasm::Name,_wasm::HeapType> *__k;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  pointer puVar6;
  undefined1 local_1a0 [8];
  FunctionRefReplacer replacer;
  
  replacer.maybeReplace._M_invoker = (_Invoker_type)replacements;
  FunctionRefReplacer::FunctionRefReplacer
            ((FunctionRefReplacer *)local_1a0,(MaybeReplace *)&replacer.maybeReplace._M_invoker);
  __dest = &replacer.maybeReplace._M_invoker;
  std::
  _Function_handler<void_(wasm::Name_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/opt-utils.h:89:23)>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
  ::run((WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
         *)local_1a0,runner,module);
  WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
  ::runOnModuleCode((WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
                     *)local_1a0,runner,module);
  if ((module->start).super_IString.str._M_str != (char *)0x0) {
    cVar5 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
            ::find(&replacements->_M_t,&module->start);
    if ((_Rb_tree_header *)cVar5._M_node != &(replacements->_M_t)._M_impl.super__Rb_tree_header) {
      p_Var4 = cVar5._M_node[1]._M_right;
      (module->start).super_IString.str._M_len = (size_t)cVar5._M_node[1]._M_left;
      (module->start).super_IString.str._M_str = (char *)p_Var4;
    }
  }
  puVar6 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar2) {
    do {
      pEVar3 = (puVar6->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar3->kind == Function) {
        if (*(__index_type *)
             ((long)&(pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          __k = &pEVar3->value;
        }
        else {
          __k = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        cVar5 = std::
                _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::find(&replacements->_M_t,(key_type *)__k);
        if ((_Rb_tree_header *)cVar5._M_node != &(replacements->_M_t)._M_impl.super__Rb_tree_header)
        {
          p_Var4 = cVar5._M_node[1]._M_right;
          *(_Base_ptr *)
           &(__k->super__Variant_base<wasm::Name,_wasm::HeapType>).
            super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_ctor_alias<wasm::Name,_wasm::HeapType> = cVar5._M_node[1]._M_left;
          *(_Base_ptr *)
           ((long)&(__k->super__Variant_base<wasm::Name,_wasm::HeapType>).
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType> + 8) = p_Var4;
        }
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  local_1a0 = (undefined1  [8])&PTR__FunctionRefReplacer_01072230;
  if (replacer.maybeReplace.super__Function_base._M_functor._8_8_ != 0) {
    ppMVar1 = &replacer.
               super_WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
               .
               super_PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>
               .
               super_Walker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>
               .currModule;
    (*(code *)replacer.maybeReplace.super__Function_base._M_functor._8_8_)(ppMVar1,ppMVar1,3);
  }
  if (replacer.
      super_WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
      .
      super_PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>
      .
      super_Walker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>
      .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
    operator_delete(replacer.
                    super_WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
                    .
                    super_PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>
                    .
                    super_Walker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)replacer.
                          super_WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
                          .
                          super_PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>
                          .
                          super_Walker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)replacer.
                          super_WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
                          .
                          super_PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>
                          .
                          super_Walker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  Pass::~Pass((Pass *)local_1a0);
  return;
}

Assistant:

inline void replaceFunctions(PassRunner* runner,
                             Module& module,
                             const std::map<Name, Name>& replacements) {
  auto maybeReplace = [&](Name& name) {
    auto iter = replacements.find(name);
    if (iter != replacements.end()) {
      name = iter->second;
    }
  };
  // replace direct calls in code both functions and module elements
  FunctionRefReplacer replacer(maybeReplace);
  replacer.run(runner, &module);
  replacer.runOnModuleCode(runner, &module);

  // replace in start
  if (module.start.is()) {
    maybeReplace(module.start);
  }
  // replace in exports
  for (auto& exp : module.exports) {
    if (exp->kind == ExternalKind::Function) {
      maybeReplace(*exp->getInternalName());
    }
  }
}